

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFrom(_func_void *value)

{
  size_t extraout_RDX;
  SimpleString *in_RDI;
  SimpleString SVar1;
  _func_void *in_stack_ffffffffffffffa8;
  SimpleString *in_stack_ffffffffffffffd0;
  SimpleString *in_stack_ffffffffffffffd8;
  
  SimpleString::SimpleString(in_RDI,(char *)in_stack_ffffffffffffffa8);
  HexStringFrom(in_stack_ffffffffffffffa8);
  SimpleString::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  SimpleString::~SimpleString((SimpleString *)0x10f8ed);
  SimpleString::~SimpleString((SimpleString *)0x10f8f7);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)in_RDI;
  return SVar1;
}

Assistant:

SimpleString StringFrom(void (*value)())
{
    return SimpleString("0x") + HexStringFrom(value);
}